

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O3

civil_lookup * __thiscall
absl::lts_20240722::time_internal::cctz::TimeZoneInfo::TimeLocal
          (civil_lookup *__return_storage_ptr__,TimeZoneInfo *this,civil_second *cs,year_t c4_shift)

{
  long lVar1;
  long lVar2;
  long lVar3;
  time_point<seconds> *local_30 [3];
  
  lVar2 = (cs->f_).y;
  if ((this->last_year_ + -400 < lVar2) && (lVar2 <= this->last_year_)) {
    (*(this->super_TimeZoneIf)._vptr_TimeZoneIf[3])(__return_storage_ptr__);
    if (c4_shift < 0x2b8d7bd2) {
      local_30[0] = &__return_storage_ptr__->pre;
      local_30[1] = &__return_storage_ptr__->trans;
      local_30[2] = &__return_storage_ptr__->post;
      lVar2 = 0;
      do {
        lVar1 = **(long **)((long)local_30 + lVar2);
        lVar3 = lVar1 + c4_shift * 0x2f0605980;
        if (c4_shift * -0x2f0605980 + 0x7fffffffffffffff < lVar1) {
          lVar3 = 0x7fffffffffffffff;
        }
        **(long **)((long)local_30 + lVar2) = lVar3;
        lVar2 = lVar2 + 8;
      } while (lVar2 != 0x18);
    }
    else {
      (__return_storage_ptr__->post).__d.__r = 0x7fffffffffffffff;
      (__return_storage_ptr__->trans).__d.__r = 0x7fffffffffffffff;
      (__return_storage_ptr__->pre).__d.__r = 0x7fffffffffffffff;
    }
    return __return_storage_ptr__;
  }
  __assert_fail("last_year_ - 400 < cs.year() && cs.year() <= last_year_",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/time/internal/cctz/src/time_zone_info.cc"
                ,0x360,
                "time_zone::civil_lookup absl::time_internal::cctz::TimeZoneInfo::TimeLocal(const civil_second &, year_t) const"
               );
}

Assistant:

time_zone::civil_lookup TimeZoneInfo::TimeLocal(const civil_second& cs,
                                                year_t c4_shift) const {
  assert(last_year_ - 400 < cs.year() && cs.year() <= last_year_);
  time_zone::civil_lookup cl = MakeTime(cs);
  if (c4_shift > seconds::max().count() / kSecsPer400Years) {
    cl.pre = cl.trans = cl.post = time_point<seconds>::max();
  } else {
    const auto offset = seconds(c4_shift * kSecsPer400Years);
    const auto limit = time_point<seconds>::max() - offset;
    for (auto* tp : {&cl.pre, &cl.trans, &cl.post}) {
      if (*tp > limit) {
        *tp = time_point<seconds>::max();
      } else {
        *tp += offset;
      }
    }
  }
  return cl;
}